

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveImports.cpp
# Opt level: O0

void __thiscall wasm::RemoveImports::~RemoveImports(RemoveImports *this)

{
  RemoveImports *this_local;
  
  ~RemoveImports(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

void visitCall(Call* curr) {
    auto* func = getModule()->getFunction(curr->target);
    if (!func->imported()) {
      return;
    }
    Type type = func->getResults();
    if (type == Type::none) {
      replaceCurrent(getModule()->allocator.alloc<Nop>());
    } else {
      Literal nopLiteral(type);
      replaceCurrent(getModule()->allocator.alloc<Const>()->set(nopLiteral));
    }
  }